

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMetaDataCompare(FmsMetaData lhs,FmsMetaData rhs)

{
  FmsIntType itype;
  FmsScalarType stype;
  char *__s1;
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FmsInt FVar6;
  uint uVar7;
  FmsInt FVar8;
  FmsInt NE;
  bool bVar9;
  bool bVar10;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (FmsMetaData)0x0) {
    return -1;
  }
  if (rhs == (FmsMetaData)0x0) {
    return -2;
  }
  __s1 = lhs->name;
  if (__s1 == (char *)0x0) {
    uVar7 = 2;
  }
  else if (rhs->name == (char *)0x0) {
    uVar7 = 3;
  }
  else {
    iVar4 = strcmp(__s1,rhs->name);
    uVar7 = (uint)(iVar4 != 0);
  }
  uVar3 = uVar7 + 10;
  if (lhs->md_type == rhs->md_type) {
    uVar3 = uVar7;
  }
  if (uVar3 != 0) {
    return uVar3;
  }
  switch(lhs->md_type) {
  case FMS_INTEGER:
    itype = (lhs->sub_type).int_type;
    bVar9 = itype == (rhs->sub_type).int_type;
    iVar4 = 100;
    if (bVar9) {
      iVar4 = 0;
    }
    FVar6 = lhs->num_entries;
    bVar10 = FVar6 == rhs->num_entries;
    iVar5 = iVar4 + 1000;
    if (bVar10) {
      iVar5 = iVar4;
    }
    if (!bVar10 || !bVar9) {
      return iVar5;
    }
    FVar6 = CompareIntData(itype,FVar6,lhs->data,rhs->data);
    goto LAB_0010a64b;
  case FMS_SCALAR:
    stype = (lhs->sub_type).scalar_type;
    bVar9 = stype == (rhs->sub_type).int_type;
    iVar4 = 100;
    if (bVar9) {
      iVar4 = 0;
    }
    FVar6 = lhs->num_entries;
    bVar10 = FVar6 == rhs->num_entries;
    iVar5 = iVar4 + 1000;
    if (bVar10) {
      iVar5 = iVar4;
    }
    if (!bVar10 || !bVar9) {
      return iVar5;
    }
    FVar6 = CompareScalarData(stype,FVar6,lhs->data,rhs->data);
LAB_0010a64b:
    iVar4 = 100000;
    if (FVar6 == 0) {
      iVar4 = 0;
    }
    break;
  case FMS_STRING:
    if (((char *)lhs->data == (char *)0x0) || ((char *)rhs->data == (char *)0x0)) {
      if (__s1 == (char *)0x0) {
        iVar4 = 100;
      }
      else {
        iVar4 = 200;
        if (rhs->name != (char *)0x0) {
          iVar4 = 0;
        }
      }
    }
    else {
      iVar5 = strcmp((char *)lhs->data,(char *)rhs->data);
      iVar4 = 100000;
      if (iVar5 == 0) {
        iVar4 = 0;
      }
    }
    break;
  case FMS_META_DATA:
    FVar6 = lhs->num_entries;
    iVar4 = 100;
    if ((FVar6 == rhs->num_entries) && (iVar4 = 0, FVar6 != 0)) {
      pvVar1 = lhs->data;
      pvVar2 = rhs->data;
      FVar8 = 0;
      do {
        iVar4 = FmsMetaDataCompare(*(FmsMetaData *)((long)pvVar1 + FVar8 * 8),
                                   *(FmsMetaData *)((long)pvVar2 + FVar8 * 8));
        if (iVar4 != 0) {
          return iVar4;
        }
        FVar8 = FVar8 + 1;
        iVar4 = 0;
      } while (FVar6 != FVar8);
    }
    break;
  default:
    iVar4 = 1000000;
  }
  return iVar4;
}

Assistant:

int FmsMetaDataCompare(FmsMetaData lhs, FmsMetaData rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  // It's possible for metadata not to have a name (because it was never set)
  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;
  // If they are both null then they are the same

  if(lhs->md_type != rhs->md_type) {
    diff += 10;
  }

  // Only compare the data is everything has been the same so far
  if(diff == 0) {
    switch(lhs->md_type) {
    case FMS_INTEGER: {
      if(lhs->sub_type.int_type != rhs->sub_type.int_type)
        diff += 100;

      if(lhs->num_entries != rhs->num_entries)
        diff += 1000;

      if(diff == 0) {
        if(CompareIntData(lhs->sub_type.int_type, lhs->num_entries, lhs->data,
                          rhs->data))
          diff += 100000;
      }
      break;
    }
    case FMS_SCALAR: {
      if(lhs->sub_type.scalar_type != rhs->sub_type.scalar_type)
        diff += 100;

      if(lhs->num_entries != rhs->num_entries)
        diff += 1000;

      if(diff == 0) {
        if(CompareScalarData(lhs->sub_type.scalar_type, lhs->num_entries, lhs->data,
                             rhs->data))
          diff += 100000;
      }
      break;
    }
    case FMS_STRING: {
      if(lhs->data && rhs->data) {
        if(strcmp(lhs->data, rhs->data))
          diff += 100000;
      } else if(!lhs->name)
        diff += 100;
      else if(!rhs->name)
        diff += 200;
      break;
    }
    case FMS_META_DATA: {
      if(lhs->num_entries != rhs->num_entries)
        diff += 100;

      if(diff == 0) {
        FmsMetaData *ldata = (FmsMetaData*)lhs->data;
        FmsMetaData *rdata = (FmsMetaData*)rhs->data;
        const FmsInt NE = lhs->num_entries;
        for(FmsInt i = 0; i < NE; i++) {
          diff += FmsMetaDataCompare(ldata[i], rdata[i]);
          if(diff)
            break;
        }
      }
      break;
    }
    default: {
      diff += 1000000;
      break;
    }
    }
  }
  return diff;
}